

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# having_binder.cpp
# Opt level: O3

void __thiscall
duckdb::HavingBinder::HavingBinder
          (HavingBinder *this,Binder *binder,ClientContext *context,BoundSelectNode *node,
          BoundGroupInformation *info,AggregateHandling aggregate_handling)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  LogicalType local_38;
  
  ExpressionBinder::ExpressionBinder((ExpressionBinder *)this,binder,context,false);
  (this->super_BaseSelectBinder).inside_window = false;
  (this->super_BaseSelectBinder).bound_aggregate = false;
  (this->super_BaseSelectBinder).node = node;
  (this->super_BaseSelectBinder).info = info;
  (this->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder =
       (_func_int **)&PTR__HavingBinder_0197d6a0;
  ColumnAliasBinder::ColumnAliasBinder(&this->column_alias_binder,&node->bind_state);
  this->aggregate_handling = aggregate_handling;
  LogicalType::LogicalType(&local_38,BOOLEAN);
  (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.id_ = local_38.id_;
  (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.physical_type_ =
       local_38.physical_type_;
  peVar1 = (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_38.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_38.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_38.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  local_38.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  LogicalType::~LogicalType(&local_38);
  return;
}

Assistant:

HavingBinder::HavingBinder(Binder &binder, ClientContext &context, BoundSelectNode &node, BoundGroupInformation &info,
                           AggregateHandling aggregate_handling)
    : BaseSelectBinder(binder, context, node, info), column_alias_binder(node.bind_state),
      aggregate_handling(aggregate_handling) {
	target_type = LogicalType(LogicalTypeId::BOOLEAN);
}